

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O2

void __thiscall CECorrections::SetInterp(CECorrections *this,bool set_interp)

{
  if (this->interp_ != set_interp) {
    this->interp_ = set_interp;
    this->cache_nut_mjd_ = -1e+30;
    this->cache_ttut1_mjd_ = -1e+30;
  }
  return;
}

Assistant:

void CECorrections::SetInterp(bool set_interp)
{
    // Only update if the value is different
    if (set_interp != interp_) {
        interp_ = set_interp;
        // Update cached dates to force recompute
        cache_nut_mjd_   = -1.0e30;
        cache_ttut1_mjd_ = -1.0e30;
    }
}